

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  ulong *puVar1;
  ushort *puVar2;
  roaring64_bitmap_t *prVar3;
  art_ref_t ref;
  long lVar4;
  _Bool _Var5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint32_t wordindex;
  uint uVar10;
  uint16_t low16;
  art_iterator_t local_b0;
  
  puVar1 = (it->art_it).value;
  if (puVar1 == (ulong *)0x0) {
    if (it->saturated_forward == true) {
      it->has_value = false;
    }
    else {
      prVar3 = it->r;
      memset(&local_b0,0,0x90);
      ref = (prVar3->art).root;
      local_b0.art = &prVar3->art;
      if (ref != 0) {
        art_node_init_iterator(ref,&local_b0,true);
      }
      memcpy(&it->art_it,&local_b0,0x90);
      puVar1 = (it->art_it).value;
      it->has_value = puVar1 != (ulong *)0x0;
      if (puVar1 != (ulong *)0x0) {
        uVar7 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar6 = (ulong)*(uint6 *)(it->art_it).key;
        uVar6 = (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
        it->high48 = uVar6;
        uVar7 = *puVar1;
        puVar2 = *(ushort **)((long)it->r->containers[uVar7 >> 8] + 8);
        if (((char)uVar7 == '\x03') || (((uint)uVar7 & 0xff) == 2)) {
          uVar8 = (uint)*puVar2;
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          iVar9 = -0x40;
          do {
            uVar7 = *(ulong *)(puVar2 + (ulong)uVar10 * 4);
            uVar10 = uVar10 + 1;
            iVar9 = iVar9 + 0x40;
          } while (uVar7 == 0);
          lVar4 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar8 = (int)lVar4 + iVar9;
          uVar10 = uVar8;
        }
        (it->container_it).index = uVar10;
        it->value = uVar6 | uVar8 & 0xffff;
        it->has_value = true;
        return true;
      }
      it->saturated_forward = true;
    }
    return false;
  }
  uVar7 = *puVar1;
  local_b0.key._0_2_ = SUB82(it->value,0);
  _Var5 = container_iterator_next
                    (it->r->containers[uVar7 >> 8],(uint8_t)uVar7,&it->container_it,
                     (uint16_t *)&local_b0);
  if (_Var5) {
    uVar6 = (ulong)(ushort)local_b0.key._0_2_ | it->high48;
  }
  else {
    _Var5 = art_iterator_move(&it->art_it,true);
    if (!_Var5) {
      it->saturated_forward = true;
      _Var5 = false;
      goto LAB_00129839;
    }
    uVar7 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
    uVar6 = (ulong)*(uint6 *)(it->art_it).key;
    uVar6 = (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
            (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
            uVar6 << 0x38;
    it->high48 = uVar6;
    uVar7 = *(it->art_it).value;
    puVar2 = *(ushort **)((long)it->r->containers[uVar7 >> 8] + 8);
    if (((char)uVar7 == '\x03') || (((uint)uVar7 & 0xff) == 2)) {
      uVar8 = (uint)*puVar2;
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      iVar9 = -0x40;
      do {
        uVar7 = *(ulong *)(puVar2 + (ulong)uVar10 * 4);
        uVar10 = uVar10 + 1;
        iVar9 = iVar9 + 0x40;
      } while (uVar7 == 0);
      lVar4 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar8 = (int)lVar4 + iVar9;
      uVar10 = uVar8;
    }
    (it->container_it).index = uVar10;
    uVar6 = uVar6 | uVar8 & 0xffff;
  }
  it->value = uVar6;
  _Var5 = true;
LAB_00129839:
  it->has_value = _Var5;
  return _Var5;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->r, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t leaf = (leaf_t)*it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(get_container(it->r, leaf), get_typecode(leaf),
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}